

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O2

void done_in_by(monst *mtmp)

{
  char cVar1;
  permonst *ppVar2;
  ulong uVar3;
  char buf [256];
  char acStack_118 [264];
  
  killer_format = done_in_by_format(mtmp,acStack_118);
  ppVar2 = mtmp->data;
  cVar1 = ppVar2->mlet;
  uVar3 = 0xec;
  if (cVar1 == '1') {
LAB_0019151e:
    u.ugrave_arise = (int)uVar3;
  }
  else {
    if (urace.mummynum == -1 || cVar1 != '\'') {
      if (((cVar1 != '0') && ((ppVar2->mflags2 & 0x100) == 0)) ||
         (uVar3 = 0xe8, urace.malenum != 0x10b)) {
        if (ppVar2 != mons + 0xfd) goto LAB_0019159a;
        uVar3 = 0xfd;
      }
      goto LAB_0019151e;
    }
    u.ugrave_arise = (int)urace.mummynum;
LAB_0019159a:
    uVar3 = (ulong)(uint)u.ugrave_arise;
    if (u.ugrave_arise < 0) goto LAB_001915c0;
  }
  if ((mvitals[uVar3].mvflags & 2) != 0) {
    u.ugrave_arise = -1;
  }
LAB_001915c0:
  killer = acStack_118;
  pline("You die...");
  done((uint)(mtmp->data == mons + 0xb || mtmp->data == mons + 0xc) << 3);
  return;
}

Assistant:

void done_in_by(const struct monst *mtmp)
{
	char buf[BUFSZ];
	killer_format = done_in_by_format(mtmp, buf);
	killer = buf;

	if (mtmp->data->mlet == S_WRAITH)
		u.ugrave_arise = PM_WRAITH;
	else if (mtmp->data->mlet == S_MUMMY && urace.mummynum != NON_PM)
		u.ugrave_arise = urace.mummynum;
	else if (is_vampire(mtmp->data) && Race_if (PM_HUMAN))
		u.ugrave_arise = PM_VAMPIRE;
	else if (mtmp->data == &mons[PM_GHOUL])
		u.ugrave_arise = PM_GHOUL;
	if (u.ugrave_arise >= LOW_PM &&
				(mvitals[u.ugrave_arise].mvflags & G_GENOD))
		u.ugrave_arise = NON_PM;

	pline("You die...");
	if (touch_petrifies(mtmp->data))
		done(STONING);
	else
		done(DIED);
}